

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

Aig_Man_t * Saig_ManCreateEquivMiter(Aig_Man_t *pAig,Vec_Int_t *vPairs,int fAddOuts)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  Aig_Man_t *p;
  size_t sVar3;
  char *__dest;
  Aig_Obj_t *pAVar4;
  ulong uVar5;
  Vec_Ptr_t *pVVar6;
  ulong uVar7;
  Aig_Obj_t *p1;
  void *pvVar8;
  long lVar9;
  void *pvVar10;
  int iVar11;
  
  if (pAig->nConstrs < 1) {
    p = Aig_ManStart(pAig->nObjs[6] + pAig->nObjs[5]);
    __s = pAig->pName;
    if (__s == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      sVar3 = strlen(__s);
      __dest = (char *)malloc(sVar3 + 1);
      strcpy(__dest,__s);
    }
    p->pName = __dest;
    p->nConstrs = pAig->nConstrs;
    pAig->pConst1->field_5 = (anon_union_8_3_a781e0d5_for_Aig_Obj_t__13)p->pConst1;
    pVVar6 = pAig->vCis;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pvVar10 = pVVar6->pArray[lVar9];
        pAVar4 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar4;
        lVar9 = lVar9 + 1;
        pVVar6 = pAig->vCis;
      } while (lVar9 < pVVar6->nSize);
    }
    pVVar6 = pAig->vObjs;
    if (0 < pVVar6->nSize) {
      lVar9 = 0;
      do {
        pvVar10 = pVVar6->pArray[lVar9];
        if ((pvVar10 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar10 + 0x18) & 7) - 7)) {
          if (((ulong)pvVar10 & 1) != 0) goto LAB_006e0de8;
          uVar5 = *(ulong *)((long)pvVar10 + 8) & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar10 + 8) & 1) ^ *(ulong *)(uVar5 + 0x28));
          }
          uVar5 = *(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe;
          if (uVar5 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar10 + 0x10) & 1) ^ *(ulong *)(uVar5 + 0x28));
          }
          pAVar4 = Aig_And(p,pAVar4,p1);
          *(Aig_Obj_t **)((long)pvVar10 + 0x28) = pAVar4;
          pVVar6 = pAig->vObjs;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < pVVar6->nSize);
    }
    uVar2 = vPairs->nSize;
    if ((uVar2 & 1) != 0) {
      __assert_fail("Vec_IntSize(vPairs) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                    ,0x72,"Aig_Man_t *Saig_ManCreateEquivMiter(Aig_Man_t *, Vec_Int_t *, int)");
    }
    if (0 < (int)uVar2) {
      lVar9 = 1;
      do {
        pVVar6 = pAig->vObjs;
        if (pVVar6 == (Vec_Ptr_t *)0x0) {
          if ((int)uVar2 <= lVar9) goto LAB_006e0dc9;
          pvVar10 = (void *)0x0;
          pvVar8 = (void *)0x0;
        }
        else {
          uVar1 = vPairs->pArray[lVar9 + -1];
          if (((int)uVar1 < 0) || (pVVar6->nSize <= (int)uVar1)) goto LAB_006e0daa;
          if ((int)uVar2 <= lVar9) {
LAB_006e0dc9:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar11 = vPairs->pArray[lVar9];
          if (((long)iVar11 < 0) || (pVVar6->nSize <= iVar11)) goto LAB_006e0daa;
          pvVar10 = pVVar6->pArray[uVar1];
          pvVar8 = pVVar6->pArray[iVar11];
        }
        pAVar4 = Aig_Exor(p,*(Aig_Obj_t **)((long)pvVar10 + 0x28),
                          *(Aig_Obj_t **)((long)pvVar8 + 0x28));
        Aig_ObjCreateCo(p,(Aig_Obj_t *)
                          ((ulong)((*(uint *)((long)pvVar8 + 0x18) ^ *(uint *)((long)pvVar10 + 0x18)
                                   ) >> 3 & 1) ^ (ulong)pAVar4));
        uVar2 = vPairs->nSize;
        iVar11 = (int)lVar9;
        lVar9 = lVar9 + 2;
      } while (iVar11 + 1 < (int)uVar2);
    }
    if (fAddOuts == 0) {
      Aig_ManCleanup(p);
    }
    else {
      if (0 < pAig->nRegs) {
        iVar11 = 0;
        do {
          uVar2 = pAig->nTruePos + iVar11;
          if (((int)uVar2 < 0) || (pAig->vCos->nSize <= (int)uVar2)) {
LAB_006e0daa:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar10 = pAig->vCos->pArray[uVar2];
          if (((ulong)pvVar10 & 1) != 0) {
LAB_006e0de8:
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                          ,0x138,"Aig_Obj_t *Aig_ObjChild0Copy(Aig_Obj_t *)");
          }
          uVar5 = *(ulong *)((long)pvVar10 + 8);
          uVar7 = uVar5 & 0xfffffffffffffffe;
          if (uVar7 == 0) {
            pAVar4 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar4 = (Aig_Obj_t *)((ulong)((uint)uVar5 & 1) ^ *(ulong *)(uVar7 + 0x28));
          }
          Aig_ObjCreateCo(p,pAVar4);
          iVar11 = iVar11 + 1;
        } while (iVar11 < pAig->nRegs);
      }
      Aig_ManCleanup(p);
      Aig_ManSetRegNum(p,pAig->nRegs);
    }
  }
  else {
    puts("The AIG manager should have no constraints.");
    p = (Aig_Man_t *)0x0;
  }
  return p;
}

Assistant:

Aig_Man_t * Saig_ManCreateEquivMiter( Aig_Man_t * pAig, Vec_Int_t * vPairs, int fAddOuts )
{
    Aig_Man_t * pAigNew;
    Aig_Obj_t * pObj, * pObj2, * pMiter;
    int i;
    if ( pAig->nConstrs > 0 )
    {
        printf( "The AIG manager should have no constraints.\n" );
        return NULL;
    }
    // start the new manager
    pAigNew = Aig_ManStart( Aig_ManNodeNum(pAig) );
    pAigNew->pName = Abc_UtilStrsav( pAig->pName );
    pAigNew->nConstrs = pAig->nConstrs;
    // map the constant node
    Aig_ManConst1(pAig)->pData = Aig_ManConst1( pAigNew );
    // create variables for PIs
    Aig_ManForEachCi( pAig, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pAigNew );
    // add internal nodes of this frame
    Aig_ManForEachNode( pAig, pObj, i )
        pObj->pData = Aig_And( pAigNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create POs
    assert( Vec_IntSize(vPairs) % 2 == 0 );
    Aig_ManForEachObjVec( vPairs, pAig, pObj, i )
    {
        pObj2  = Aig_ManObj( pAig, Vec_IntEntry(vPairs, ++i) );
        pMiter = Aig_Exor( pAigNew, (Aig_Obj_t *)pObj->pData, (Aig_Obj_t *)pObj2->pData );
        pMiter = Aig_NotCond( pMiter, pObj->fPhase ^ pObj2->fPhase );
        Aig_ObjCreateCo( pAigNew, pMiter );
    }
    // transfer to register outputs
    if ( fAddOuts )
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjCreateCo( pAigNew, Aig_ObjChild0Copy(pObj) );
    Aig_ManCleanup( pAigNew );
    if ( fAddOuts )
    Aig_ManSetRegNum( pAigNew, Aig_ManRegNum(pAig) );
    return pAigNew;
}